

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::anon_unknown_0::
StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::Unwind<true>
          (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *this,
          CordRepBtree *tree,int depth,size_t length,OpResult result)

{
  long lVar1;
  CordRepBtree *pCVar2;
  size_t sVar3;
  OpResult OVar4;
  OpResult result_00;
  CordRepBtree *pCStack_48;
  bool owned;
  CordRepBtree *node;
  size_t length_local;
  int depth_local;
  CordRepBtree *tree_local;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *this_local;
  OpResult result_local;
  
  this_local = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
               result.tree;
  result_local.tree = (CordRepBtree *)(ulong)result.action;
  sVar3 = length;
  length_local._4_4_ = depth;
  if (depth != 0) {
    do {
      lVar1 = (long)length_local._4_4_;
      length_local._4_4_ = length_local._4_4_ + -1;
      pCStack_48 = this->stack[lVar1 + -1];
      sVar3 = (size_t)(uint)this->share_depth;
      if ((int)result_local.tree == 0) {
        (pCStack_48->super_CordRep).length = length + (pCStack_48->super_CordRep).length;
        while (0 < length_local._4_4_) {
          length_local._4_4_ = length_local._4_4_ + -1;
          pCStack_48 = this->stack[length_local._4_4_];
          (pCStack_48->super_CordRep).length = length + (pCStack_48->super_CordRep).length;
        }
        return pCStack_48;
      }
      if ((int)result_local.tree == 1) {
        OVar4 = CordRepBtree::SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                          (pCStack_48,length_local._4_4_ < this->share_depth,(CordRep *)this_local,
                           length);
        this_local = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                      *)OVar4.tree;
        result_local.tree = (CordRepBtree *)(ulong)OVar4.action;
        sVar3 = (size_t)length_local._4_4_;
        this->stack[sVar3] = (CordRepBtree *)this_local;
      }
      else if ((int)result_local.tree == 2) {
        __assert_fail("!propagate",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                      ,0x145,
                      "CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::Unwind(CordRepBtree *, int, size_t, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront, propagate = true]"
                     );
      }
    } while (0 < length_local._4_4_);
  }
  result_00._8_8_ = sVar3;
  result_00.tree = result_local.tree;
  pCVar2 = Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *
                    )tree,(CordRepBtree *)this_local,result_00);
  return pCVar2;
}

Assistant:

inline CordRepBtree* Unwind(CordRepBtree* tree, int depth, size_t length,
                              OpResult result) {
    // TODO(mvels): revisit the below code to check if 3 loops with 3
    // (incremental) conditions is faster than 1 loop with a switch.
    // Benchmarking and perf recordings indicate the loop with switch is
    // fastest, likely because of indirect jumps on the tight case values and
    // dense branches. But it's worth considering 3 loops, as the `action`
    // transitions are mono directional. E.g.:
    //   while (action == kPopped) {
    //     ...
    //   }
    //   while (action == kCopied) {
    //     ...
    //   }
    //   ...
    // We also  found that an "if () do {}" loop here seems faster, possibly
    // because it allows the branch predictor more granular heuristics on
    // 'single leaf' (`depth` == 0) and 'single depth' (`depth` == 1) cases
    // which appear to be the most common use cases.
    if (depth != 0) {
      do {
        CordRepBtree* node = stack[--depth];
        const bool owned = depth < share_depth;
        switch (result.action) {
          case CordRepBtree::kPopped:
            assert(!propagate);
            result = node->AddEdge<edge_type>(owned, result.tree, length);
            break;
          case CordRepBtree::kCopied:
            result = node->SetEdge<edge_type>(owned, result.tree, length);
            if (propagate) stack[depth] = result.tree;
            break;
          case CordRepBtree::kSelf:
            node->length += length;
            while (depth > 0) {
              node = stack[--depth];
              node->length += length;
            }
            return node;
        }
      } while (depth > 0);
    }
    return Finalize(tree, result);
  }